

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qatomic_cxx11.h
# Opt level: O0

void QAtomicOps<signed_char>::storeRelaxed<signed_char>(atomic<signed_char> *_q_value,char newValue)

{
  memory_order mVar1;
  char in_SIL;
  char *in_RDI;
  memory_order __b;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined3 in_stack_ffffffffffffffdc;
  int __line;
  char *__file;
  
  __line = CONCAT13(in_SIL,in_stack_ffffffffffffffdc);
  __file = in_RDI;
  mVar1 = std::operator&(memory_order_relaxed,__memory_order_mask);
  if (mVar1 == memory_order_acquire) {
    std::__replacement_assert
              (__file,__line,in_RDI,
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  if (mVar1 != memory_order_acq_rel) {
    if (mVar1 != memory_order_consume) {
      *in_RDI = in_SIL;
      return;
    }
    std::__replacement_assert
              (__file,__line,in_RDI,
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  std::__replacement_assert
            (__file,__line,in_RDI,
             (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
}

Assistant:

static inline
    void storeRelaxed(std::atomic<T> &_q_value, T newValue) noexcept
    {
        _q_value.store(newValue, std::memory_order_relaxed);
    }